

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_11_additive_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->ss = G->val[-4];
  return;
}

Assistant:

YY_ACTION(void) yy_11_additive_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define r2 G->val[-1]
#define r1 G->val[-2]
#define r G->val[-3]
#define l G->val[-4]
  yyprintf((stderr, "do yy_11_additive_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        yy = l;\n\
    }\n"));
  
        yy = l;
    ;
#undef r2
#undef r1
#undef r
#undef l
}